

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

void Abc_NtkPartitionCompact(Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll,int nSuppSizeLimit)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vArr1;
  int *__dest;
  uint uVar6;
  long lVar7;
  Vec_Int_t *vArr1_00;
  
  iVar2 = 200;
  if (nSuppSizeLimit != 0) {
    iVar2 = nSuppSizeLimit;
  }
  iVar3 = vPartSuppsAll->nSize;
  if (iVar3 < 1) {
    pVVar5 = (Vec_Int_t *)0x0;
    vArr1 = (Vec_Int_t *)0x0;
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    vArr1 = (Vec_Int_t *)0x0;
    vArr1_00 = (Vec_Int_t *)0x0;
    do {
      pVVar5 = (Vec_Int_t *)vPartSuppsAll->pArray[lVar7];
      iVar3 = pVVar5->nSize;
      if (iVar3 < iVar2) {
        if (vArr1 == (Vec_Int_t *)0x0) {
          if (vArr1_00 != (Vec_Int_t *)0x0) {
            __assert_fail("vPart == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                          ,0x29b,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
          }
          vArr1 = (Vec_Int_t *)malloc(0x10);
          vArr1->nSize = iVar3;
          vArr1->nCap = iVar3;
          if (iVar3 == 0) {
            __dest = (int *)0x0;
          }
          else {
            __dest = (int *)malloc((long)iVar3 * 4);
          }
          vArr1->pArray = __dest;
          memcpy(__dest,pVVar5->pArray,(long)iVar3 << 2);
          if (vPartsAll->nSize <= lVar7) goto LAB_002e9182;
          pVVar5 = (Vec_Int_t *)vPartsAll->pArray[lVar7];
        }
        else {
          pVVar4 = Vec_IntTwoMerge(vArr1,pVVar5);
          if (vArr1->pArray != (int *)0x0) {
            free(vArr1->pArray);
            vArr1->pArray = (int *)0x0;
          }
          free(vArr1);
          if (vPartsAll->nSize <= lVar7) goto LAB_002e9182;
          pVVar5 = Vec_IntTwoMerge(vArr1_00,(Vec_Int_t *)vPartsAll->pArray[lVar7]);
          if (vArr1_00->pArray != (int *)0x0) {
            free(vArr1_00->pArray);
            vArr1_00->pArray = (int *)0x0;
          }
          if (vArr1_00 != (Vec_Int_t *)0x0) {
            free(vArr1_00);
          }
          if (vPartsAll->nSize <= lVar7) goto LAB_002e9182;
          pvVar1 = vPartsAll->pArray[lVar7];
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          vArr1 = pVVar4;
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        if (iVar2 <= vArr1->nSize) goto LAB_002e9044;
      }
      else {
        if (vPartsAll->nSize <= lVar7) goto LAB_002e9182;
        pVVar5 = (Vec_Int_t *)vPartsAll->pArray[lVar7];
LAB_002e9044:
        if (((int)uVar6 < 0) || (vPartsAll->nSize <= (int)uVar6)) goto LAB_002e9163;
        vPartsAll->pArray[uVar6] = pVVar5;
        if (vArr1 != (Vec_Int_t *)0x0) {
          if (vPartSuppsAll->nSize <= (int)uVar6) goto LAB_002e9182;
          pvVar1 = vPartSuppsAll->pArray[uVar6];
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
          if (vPartSuppsAll->nSize <= (int)uVar6) goto LAB_002e9163;
          vPartSuppsAll->pArray[uVar6] = vArr1;
        }
        uVar6 = uVar6 + 1;
        pVVar5 = (Vec_Int_t *)0x0;
        vArr1 = (Vec_Int_t *)0x0;
      }
      lVar7 = lVar7 + 1;
      iVar3 = vPartSuppsAll->nSize;
      vArr1_00 = pVVar5;
    } while (lVar7 < iVar3);
  }
  if (pVVar5 == (Vec_Int_t *)0x0) {
LAB_002e914a:
    if (vPartsAll->nSize < (int)uVar6) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vPartsAll->nSize = uVar6;
    return;
  }
  if ((-1 < (int)uVar6) && ((int)uVar6 < vPartsAll->nSize)) {
    vPartsAll->pArray[uVar6] = pVVar5;
    if (vArr1 == (Vec_Int_t *)0x0) {
      __assert_fail("vPartSupp != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                    ,0x2bd,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
    }
    if (iVar3 <= (int)uVar6) {
LAB_002e9182:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar1 = vPartSuppsAll->pArray[uVar6];
    if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 8));
      *(undefined8 *)((long)pvVar1 + 8) = 0;
    }
    if (pvVar1 != (void *)0x0) {
      free(pvVar1);
    }
    if ((int)uVar6 < vPartSuppsAll->nSize) {
      vPartSuppsAll->pArray[uVar6] = vArr1;
      uVar6 = uVar6 + 1;
      goto LAB_002e914a;
    }
  }
LAB_002e9163:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Abc_NtkPartitionCompact( Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll, int nSuppSizeLimit )
{
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart;

    if ( nSuppSizeLimit == 0 )
        nSuppSizeLimit = 200;

    // pack smaller partitions into larger blocks
    iPart = 0;
    vPart = vPartSupp = NULL;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        if ( Vec_IntSize(vOne) < nSuppSizeLimit )
        {
            if ( vPartSupp == NULL )
            {
                assert( vPart == NULL );
                vPartSupp = Vec_IntDup(vOne);
                vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
            }
            else
            {
                vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
                Vec_IntFree( vTemp );
                vPart = Vec_IntTwoMerge( vTemp = vPart, (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
                Vec_IntFree( vTemp );
                Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
            }
            if ( Vec_IntSize(vPartSupp) < nSuppSizeLimit )
                continue;
        }
        else
            vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
        // add the partition 
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;
        if ( vPartSupp ) 
        {
            Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
            vPartSupp = NULL;
        }
        iPart++;
    }
    // add the last one
    if ( vPart )
    {
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;

        assert( vPartSupp != NULL );
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
        Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
        vPartSupp = NULL;
        iPart++;
    }
    Vec_PtrShrink( vPartsAll, iPart );
    Vec_PtrShrink( vPartsAll, iPart );
}